

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_in_out_testing_v2.cpp
# Opt level: O2

void string_in_out_testing_v2
               (string *base_path,string *problem_no,list<int,_std::allocator<int>_> *files_to_run,
               _func_void *code_to_execute)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  string *psVar6;
  long lVar7;
  long lVar8;
  ostream *poVar9;
  string *this;
  _List_node_base *p_Var10;
  int local_590;
  int local_58c;
  long local_588;
  string f_no;
  string ending;
  string in_no_comment_name;
  string exp_name;
  string out_name;
  string in_name;
  string path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  string local_458;
  ofstream out_file;
  string files_count;
  
  lVar4 = std::chrono::_V2::system_clock::now();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out_file,
                 base_path,"/in_out_exp_files/");
  std::operator+(&files_count,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out_file,
                 problem_no);
  std::operator+(&path,&files_count,"/");
  std::__cxx11::string::~string((string *)&files_count);
  std::__cxx11::string::~string((string *)&out_file);
  if ((files_to_run->super__List_base<int,_std::allocator<int>_>)._M_impl._M_node.
      super__List_node_base._M_next == (_List_node_base *)files_to_run) {
    search_in_and_exp_files(&path,files_to_run);
  }
  local_588 = 0;
  local_590 = 0;
  local_58c = 0;
  p_Var10 = (_List_node_base *)files_to_run;
  do {
    p_Var10 = (((_List_base<int,_std::allocator<int>_> *)&p_Var10->_M_next)->_M_impl)._M_node.
              super__List_node_base._M_next;
    if (p_Var10 == (_List_node_base *)files_to_run) {
      std::__cxx11::to_string
                (&files_count,
                 (files_to_run->super__List_base<int,_std::allocator<int>_>)._M_impl._M_node._M_size
                );
      if (local_58c == 0) {
        std::operator+(&f_no,"\n-> Hurray, all ",&files_count);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &out_file,&f_no," provided tests passed!");
        write_colored_text((string *)&out_file,cyan);
        std::__cxx11::string::~string((string *)&out_file);
        this = &f_no;
      }
      else {
        std::__cxx11::to_string(&in_no_comment_name,local_58c);
        std::operator+(&exp_name,"\n-> ",&in_no_comment_name);
        std::operator+(&out_name,&exp_name," of ");
        std::operator+(&in_name,&out_name,&files_count);
        std::operator+(&ending,&in_name," provided tests failed with a total of ");
        std::__cxx11::to_string(&local_478,local_590);
        std::operator+(&f_no,&ending,&local_478);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &out_file,&f_no," wrong lines.");
        write_colored_text((string *)&out_file,red);
        std::__cxx11::string::~string((string *)&out_file);
        std::__cxx11::string::~string((string *)&f_no);
        std::__cxx11::string::~string((string *)&local_478);
        std::__cxx11::string::~string((string *)&ending);
        std::__cxx11::string::~string((string *)&in_name);
        std::__cxx11::string::~string((string *)&out_name);
        std::__cxx11::string::~string((string *)&exp_name);
        this = &in_no_comment_name;
      }
      std::__cxx11::string::~string((string *)this);
      std::operator<<((ostream *)&std::cout,"  Total code execution: ");
      print_time(local_588);
      std::operator<<((ostream *)&std::cout,", total overall time: ");
      lVar7 = std::chrono::_V2::system_clock::now();
      print_time((lVar7 - lVar4) / 1000);
      poVar9 = std::operator<<((ostream *)&std::cout,".");
      std::endl<char,std::char_traits<char>>(poVar9);
      std::__cxx11::string::~string((string *)&files_count);
      break;
    }
    iVar2 = *(int *)&p_Var10[1]._M_next;
    f_no._M_dataplus._M_p = (pointer)&f_no.field_2;
    f_no._M_string_length = 0;
    f_no.field_2._M_local_buf[0] = '\0';
    ending._M_dataplus._M_p = (pointer)&ending.field_2;
    ending._M_string_length = 0;
    in_name._M_dataplus._M_p = (pointer)&in_name.field_2;
    in_name._M_string_length = 0;
    out_name._M_dataplus._M_p = (pointer)&out_name.field_2;
    out_name._M_string_length = 0;
    ending.field_2._M_local_buf[0] = '\0';
    in_name.field_2._M_local_buf[0] = '\0';
    out_name.field_2._M_local_buf[0] = '\0';
    exp_name._M_dataplus._M_p = (pointer)&exp_name.field_2;
    exp_name._M_string_length = 0;
    exp_name.field_2._M_local_buf[0] = '\0';
    std::__cxx11::to_string(&files_count,iVar2);
    std::__cxx11::string::operator=((string *)&f_no,(string *)&files_count);
    std::__cxx11::string::~string((string *)&files_count);
    pcVar5 = (char *)std::__cxx11::string::append((string *)&ending);
    std::__cxx11::string::append(pcVar5);
    pcVar5 = (char *)std::__cxx11::string::append((string *)&in_name);
    psVar6 = (string *)std::__cxx11::string::append(pcVar5);
    std::__cxx11::string::append(psVar6);
    pcVar5 = (char *)std::__cxx11::string::append((string *)&out_name);
    psVar6 = (string *)std::__cxx11::string::append(pcVar5);
    std::__cxx11::string::append(psVar6);
    pcVar5 = (char *)std::__cxx11::string::append((string *)&exp_name);
    psVar6 = (string *)std::__cxx11::string::append(pcVar5);
    std::__cxx11::string::append(psVar6);
    std::operator+(&local_478,"\n",problem_no);
    std::operator+(&in_no_comment_name,&local_478,", file-nr ");
    std::__cxx11::to_string(&local_458,iVar2);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out_file,
                   &in_no_comment_name,&local_458);
    std::operator+(&files_count,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out_file,
                   "...  ");
    write_colored_text(&files_count,blue);
    std::__cxx11::string::~string((string *)&files_count);
    std::__cxx11::string::~string((string *)&out_file);
    std::__cxx11::string::~string((string *)&local_458);
    std::__cxx11::string::~string((string *)&in_no_comment_name);
    std::__cxx11::string::~string((string *)&local_478);
    create_file_with_removed_comments(&in_no_comment_name,&in_name);
    if (in_no_comment_name._M_string_length == 0) {
      bVar1 = false;
    }
    else {
      std::ifstream::ifstream(&files_count,(string *)&in_no_comment_name,_S_in);
      bVar1 = problem_with_file_to_read((ifstream *)&files_count,&in_no_comment_name);
      if (bVar1) {
        bVar1 = false;
      }
      else {
        std::ofstream::ofstream(&out_file,(string *)&out_name,_S_out);
        bVar1 = problem_with_file_to_write(&out_file,&out_name);
        if (bVar1) {
LAB_00106d69:
          bVar1 = false;
        }
        else {
          std::ios::rdbuf((streambuf *)((long)&std::cin + *(long *)(std::cin + -0x18)));
          std::ios::rdbuf((streambuf *)((long)&std::cout + *(long *)(std::cout + -0x18)));
          lVar7 = std::chrono::_V2::system_clock::now();
          (*code_to_execute)();
          lVar8 = std::chrono::_V2::system_clock::now();
          std::ios::rdbuf((streambuf *)((long)&std::cin + *(long *)(std::cin + -0x18)));
          std::ios::rdbuf((streambuf *)((long)&std::cout + *(long *)(std::cout + -0x18)));
          lVar7 = (lVar8 - lVar7) / 1000;
          std::operator<<((ostream *)&std::cout,"code: ");
          print_time(lVar7);
          std::operator<<((ostream *)&std::cout,"...  ");
          std::ofstream::close();
          std::ifstream::close();
          remove_a_file(&in_no_comment_name);
          iVar2 = execute_tests(&out_name,&exp_name);
          local_588 = local_588 + lVar7;
          if (iVar2 == -9999) goto LAB_00106d69;
          iVar3 = iVar2;
          if (iVar2 < 1) {
            iVar3 = 0;
          }
          local_590 = local_590 + iVar3;
          local_58c = local_58c + (uint)(0 < iVar2);
          bVar1 = true;
        }
        std::ofstream::~ofstream(&out_file);
      }
      std::ifstream::~ifstream(&files_count);
    }
    std::__cxx11::string::~string((string *)&in_no_comment_name);
    std::__cxx11::string::~string((string *)&exp_name);
    std::__cxx11::string::~string((string *)&out_name);
    std::__cxx11::string::~string((string *)&in_name);
    std::__cxx11::string::~string((string *)&ending);
    std::__cxx11::string::~string((string *)&f_no);
  } while (bVar1);
  std::__cxx11::string::~string((string *)&path);
  return;
}

Assistant:

void string_in_out_testing_v2(const string &base_path,
                              const string &problem_no,
                              list<int> &files_to_run,
                              void (*code_to_execute)()) {

    auto start_all = chrono::high_resolution_clock::now();

    string path = base_path + "/in_out_exp_files/" + problem_no + "/";

    // If no files were provided, then search the directory for in1.txt, in2.txt  and exp1.txt, exp2.txt and so on:
    if (files_to_run.empty()) search_in_and_exp_files(path, files_to_run);


    int file_count_failed = 0;
    int total_errors = 0;
    long int total_runtime = 0;

    for (int file_no : files_to_run) {
        // Note: Simple string concatenation would work:
//        path = path + problem_no + "/";
        // But since this concatenation is now inside a loop, CLion suggests:
        //     Clang-Tidy: String concatenation results in_file allocation of unnecessary temporary strings; consider 
        //     using 'operator+=' or 'string::append()' instead
        // See also https://www.w3schools.com/cpp/cpp_strings_concat.asp for a short explanation
        // NOTE: Strings are automatically initialized to "".
        string f_no, ending, in_name, out_name, exp_name;
        f_no = to_string(file_no);
        ending.append(f_no).append(".txt");
        in_name.append(path).append("in").append(ending);
        out_name.append(path).append("out").append(ending);
        exp_name.append(path).append("exp").append(ending);

        write_colored_text("\n" + problem_no + ", file-nr " + to_string(file_no) + "...  ", blue);

        // Creating file with removed comments in in_file:
        string in_no_comment_name = create_file_with_removed_comments(in_name);
        if (in_no_comment_name.empty()) return;

        // Open the files:
        ifstream in_no_comment_file(in_no_comment_name);
        if (problem_with_file_to_read(in_no_comment_file, in_no_comment_name)) return;
        ofstream out_file(out_name);
        if (problem_with_file_to_write(out_file, out_name)) return;


        // Switching cin (stdin) to read from file in_name and switching cout (stdout) to write to file out_name:
        streambuf *cin_buf = cin.rdbuf(in_no_comment_file.rdbuf()); // Save old buf and redirect cin to in_file.txt
        streambuf *cout_buf = cout.rdbuf(out_file.rdbuf()); // Save old buf and redirect cout to out_file.txt

        // Start the code timer:
        auto start = chrono::high_resolution_clock::now();

        // Execute passed in_file code (now using the changed cin and cout):
        code_to_execute();

        // Stop the timer:
        auto stop = chrono::high_resolution_clock::now();

        // Recreate the standard output to the terminal:
        cin.rdbuf(cin_buf);   // Reset to standard input again
        cout.rdbuf(cout_buf); // Reset to standard output again

        // Subtract stop and start time-points and cast it to required unit with duration_cast() function: 
        // Predefined units are: nanoseconds, microseconds, milliseconds, seconds, minutes, hours.
        long int micro = chrono::duration_cast<chrono::microseconds>(stop - start).count();
        cout << "code: ";
        print_time(micro);
        cout << "...  ";
        total_runtime += micro;
        // Close out_file (was open for write access - but in the tests, its needed for read-access)
        out_file.close();

        // Remove the file without comments
        in_no_comment_file.close();
        remove_a_file(in_no_comment_name);


        // Execute the tests:
        int error_count = execute_tests(out_name, exp_name);
        if (error_count == -9999) return; // abort if error in execute_tests(..) occurred
        else if (error_count > 0) {
            file_count_failed++;
            total_errors += error_count;
        }
    }

    string files_count = to_string(files_to_run.size());

    if (file_count_failed == 0) {
        write_colored_text("\n-> Hurray, all " + files_count + " provided tests passed!", cyan);
    } else {
        write_colored_text(
                "\n-> " + to_string(file_count_failed) + " of " + files_count +
                " provided tests failed with a total of " + to_string(total_errors) + " wrong lines.", red);
    }
    cout << "  Total code execution: ";
    print_time(total_runtime);
    cout << ", total overall time: ";
    auto stop_all = chrono::high_resolution_clock::now();
    long int micro_all = chrono::duration_cast<chrono::microseconds>(stop_all - start_all).count();
    print_time(micro_all);
    cout << "." << endl;

}